

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::DisconnectNode(CConnman *this,CSubNet *subnet)

{
  string_view logging_function;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  iterator iVar4;
  CSubNet *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000070;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  long *in_stack_00000088;
  bool disconnected;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock94;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  *in_stack_fffffffffffffed8;
  NodeId *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  CSubNet *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff08;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffff10;
  LogFlags in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  byte local_a9;
  NodeId local_98;
  allocator<char> local_89;
  ConstevalFormatString<2U> in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a9 = 0;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffed0);
  iVar4 = std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                    ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffed0);
  while (bVar1 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           (in_stack_fffffffffffffed8,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffed0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    uVar2 = CSubNet::Match(in_stack_fffffffffffffef0,
                           (CNetAddr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                          );
    if ((bool)uVar2) {
      uVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                  Trace);
      if ((bool)uVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)in_stack_fffffffffffffee0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)in_stack_fffffffffffffee0);
        bVar1 = (fLogIPs & 1U) == 0;
        if (bVar1) {
          __a = &local_89;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_ffffffffffffff10)),__a);
        }
        else {
          CSubNet::ToString_abi_cxx11_(in_RDI);
          tinyformat::format<std::__cxx11::string>
                    ((char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffef0);
        }
        local_98 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffecc,
                                                  in_stack_fffffffffffffec8));
        in_stack_fffffffffffffee0 = &local_98;
        in_stack_fffffffffffffed8 = local_28;
        in_stack_fffffffffffffed0 = "disconnect by subnet%s matched peer=%d; disconnecting\n";
        in_stack_fffffffffffffec8 = 1;
        logging_function._M_str = (char *)iVar4._M_current;
        logging_function._M_len = in_stack_ffffffffffffff90;
        LogPrintFormatInternal<std::__cxx11::string,long>
                  (logging_function,in_stack_ffffffffffffff80,in_stack_ffffffffffffff3c,
                   in_stack_ffffffffffffff30,in_stack_00000070,in_stack_ffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__range1,
                   in_stack_00000088);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (bVar1) {
          std::allocator<char>::~allocator(&local_89);
        }
        else {
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),false
                );
      local_a9 = 1;
    }
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_a9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CSubNet& subnet)
{
    bool disconnected = false;
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (subnet.Match(pnode->addr)) {
            LogDebug(BCLog::NET, "disconnect by subnet%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", subnet.ToString()) : ""), pnode->GetId());
            pnode->fDisconnect = true;
            disconnected = true;
        }
    }
    return disconnected;
}